

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharSet.cpp
# Opt level: O3

int __thiscall
UnifiedRegex::CharSet<char16_t>::GetCompactEntries(CharSet<char16_t> *this,uint max,Char *entries)

{
  size_t sVar1;
  code *pcVar2;
  bool bVar3;
  uint uVar4;
  undefined4 *puVar5;
  uint uVar6;
  ulong uVar7;
  
  if (4 < max) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/CharSet.cpp"
                       ,0x589,"(max <= MaxCompact)","max <= MaxCompact");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar5 = 0;
  }
  sVar1 = (this->rep).compact.countPlusOne;
  uVar6 = 0xffffffff;
  if (sVar1 - 1 < 5) {
    uVar6 = (int)sVar1 - 1;
    if (uVar6 < max) {
      max = uVar6;
    }
    if (max != 0) {
      uVar7 = 0;
      do {
        uVar4 = GetCompactCharU(this,(uint)uVar7);
        entries[uVar7] = (Char)uVar4;
        uVar7 = uVar7 + 1;
      } while (max != uVar7);
      uVar6 = *(int *)&this->rep - 1;
    }
  }
  return uVar6;
}

Assistant:

int CharSet<char16>::GetCompactEntries(uint max, __out_ecount(max) Char* entries) const
    {
        Assert(max <= MaxCompact);
        if (!IsCompact())
            return -1;

        uint count = min(max, (uint)(this->GetCompactLength()));
        __analysis_assume(count <= max);
        for (uint i = 0; i < count; i++)
        {
            // Bug in oacr. it can't figure out count is less than or equal to max
#pragma warning(suppress: 22102)
            entries[i] = this->GetCompactChar(i);
        }
        return static_cast<int>(rep.compact.countPlusOne - 1);
    }